

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
     TraceFixedFieldsBeforeTypeHandlerChange
               (char16 *oldTypeHandlerName,char16 *newTypeHandlerName,DynamicObject *instance,
               DynamicTypeHandler *oldTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  char16_t *local_60;
  DynamicObject *local_58;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore_local;
  DynamicType *oldType_local;
  DynamicTypeHandler *oldTypeHandler_local;
  DynamicObject *instance_local;
  char16 *newTypeHandlerName_local;
  char16 *oldTypeHandlerName_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    Output::Print(L"FixedFields: converting 0x%p from %s to %s:\n",instance,oldTypeHandlerName,
                  newTypeHandlerName);
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_58 = (DynamicObject *)0x0;
    }
    else {
      local_58 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(oldSingletonInstanceBefore);
    }
    Output::Print(L"   before: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p)\n",
                  oldType,oldTypeHandler,oldSingletonInstanceBefore,local_58);
    Output::Print(L"   fixed fields:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    Output::Print(L"FixedFields: converting instance from %s to %s:\n",oldTypeHandlerName,
                  newTypeHandlerName);
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_60 = L"==";
    }
    else {
      local_60 = L"!=";
    }
    Output::Print(L"   old singleton before %s null \n",local_60);
    Output::Print(L"   fixed fields before:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TraceFixedFieldsBeforeTypeHandlerChange(
        const char16* oldTypeHandlerName, const char16* newTypeHandlerName,
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler,
        DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: converting 0x%p from %s to %s:\n"), instance, oldTypeHandlerName, newTypeHandlerName);
            Output::Print(_u("   before: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p)\n"),
                oldType, oldTypeHandler, oldSingletonInstanceBefore, oldSingletonInstanceBefore != nullptr ? oldSingletonInstanceBefore->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: converting instance from %s to %s:\n"), oldTypeHandlerName, newTypeHandlerName);
            Output::Print(_u("   old singleton before %s null \n"), oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields before:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
    }